

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::SingularStringView::GenerateMemberCopyConstructor
          (SingularStringView *this,Printer *p)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if ((((this->super_FieldGeneratorBase).is_inlined_ == false) &&
      (((((this->super_FieldGeneratorBase).field_)->field_20).default_value_enum_)->all_names_ !=
       (string *)0x0)) && (this->opts_->experimental_use_micro_string != true)) {
    pcVar2 = "$name$_(arena, from.$name$_, $default_variable_name$)";
    uVar1 = 0x35;
  }
  else {
    pcVar2 = "$name$_(arena, from.$name$_)";
    uVar1 = 0x1c;
  }
  io::Printer::Emit(p,0,0,uVar1,pcVar2);
  return;
}

Assistant:

void GenerateMemberCopyConstructor(io::Printer* p) const override {
    if (is_inlined() || EmptyDefault() || use_micro_string()) {
      p->Emit("$name$_(arena, from.$name$_)");
    } else {
      p->Emit("$name$_(arena, from.$name$_, $default_variable_name$)");
    }
  }